

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

bool is_pdf_name(string *v)

{
  ulong uVar1;
  bool local_4d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *v_local;
  
  local_18 = v;
  uVar1 = std::__cxx11::string::length();
  local_4d = false;
  if (3 < uVar1) {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)local_18);
    local_4d = std::operator==(&local_38,"n:/");
  }
  v_local._7_1_ = local_4d;
  if (3 < uVar1) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (bool)(v_local._7_1_ & 1);
}

Assistant:

static bool
is_pdf_name(std::string const& v)
{
    return ((v.length() > 3) && (v.substr(0, 3) == "n:/"));
}